

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerPool.cpp
# Opt level: O3

TimerHandle __thiscall TimerPool::Timer::Create(Timer *this,PoolHandle *pool,string *name)

{
  Timer *this_00;
  TimerPool *this_01;
  int iVar1;
  _Atomic_word _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *this_02;
  Timer *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  TimerHandle TVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  TimerHandle local_40;
  
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xb8);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c38;
  this_00 = (Timer *)(p_Var3 + 1);
  Timer(this_00,pool,name);
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Timer_00109c88;
  local_48._M_pi = p_Var3;
  if ((p_Var3[2]._vptr__Sp_counted_base == (_func_int **)0x0) ||
     (*(int *)(p_Var3[2]._vptr__Sp_counted_base + 1) == 0)) {
    *(Timer **)&p_Var3[1]._M_use_count = this_00;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 2),&local_48);
  }
  this_02 = (element_type *)operator_new(0x20);
  _Var5._M_pi = local_48._M_pi;
  (this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
  super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  this_02->_vptr_Timer = (_func_int **)&PTR___Sp_counted_ptr_inplace_00109cc0;
  pTVar4 = this_00;
  if (local_48._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
    super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
    (this_02->m_mutex).super___mutex_base._M_mutex.__align = 0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      UNLOCK();
      bVar6 = __libc_single_threaded == '\0';
      (this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
      super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      (this_02->m_mutex).super___mutex_base._M_mutex.__align = (long)local_48._M_pi;
      if (bVar6) {
        LOCK();
        (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
        UNLOCK();
        pTVar4 = (Timer *)(this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
                          super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi;
        goto LAB_00105501;
      }
      iVar1 = (local_48._M_pi)->_M_use_count;
    }
    else {
      iVar1 = (local_48._M_pi)->_M_use_count + 1;
      (local_48._M_pi)->_M_use_count = iVar1;
      (this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
      super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      (this_02->m_mutex).super___mutex_base._M_mutex.__align = (long)local_48._M_pi;
    }
    (local_48._M_pi)->_M_use_count = iVar1 + 1;
  }
LAB_00105501:
  p_Var3 = (pTVar4->m_pool).super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var2 = p_Var3->_M_use_count;
    do {
      if (_Var2 == 0) goto LAB_00105583;
      LOCK();
      iVar1 = p_Var3->_M_use_count;
      bVar6 = _Var2 == iVar1;
      if (bVar6) {
        p_Var3->_M_use_count = _Var2 + 1;
        iVar1 = _Var2;
      }
      _Var2 = iVar1;
      UNLOCK();
    } while (!bVar6);
    if ((p_Var3->_M_use_count != 0) &&
       (this_01 = (pTVar4->m_pool).super___weak_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       this_01 != (TimerPool *)0x0)) {
      local_40.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_48._M_pi;
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
        }
      }
      local_40.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
      registerTimer(this_01,&local_40);
      if (local_40.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
LAB_00105583:
  if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
  }
  this->_vptr_Timer = (_func_int **)this_00;
  (this->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
  super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_02;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
             super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&(this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
                  super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    UNLOCK();
  }
  else {
    *(int *)&(this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
             super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&(this_02->super_enable_shared_from_this<TimerPool::Timer>)._M_weak_this.
                  super___weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  _Var5._M_pi = extraout_RDX;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    _Var5._M_pi = extraout_RDX_00;
  }
  TVar7.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  TVar7.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TimerHandle)TVar7.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerPool::Timer::TimerHandle TimerPool::Timer::Create(const PoolHandle& pool, const std::string& name)
{
    const auto timer      = std::make_shared<EnableConstructor<Timer>>(pool, name);
    const auto userHandle = std::make_shared<UserTimer>(timer);

    return std::shared_ptr<Timer>(userHandle, timer.get());
}